

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_aug.c
# Opt level: O3

int stbi_jpeg_test_file(FILE *f)

{
  uint8 uVar1;
  long lVar2;
  jpeg j;
  jpeg jStack_3728;
  
  lVar2 = ftell((FILE *)f);
  jStack_3728.marker = 0xff;
  jStack_3728.s.img_file = f;
  uVar1 = get_marker(&jStack_3728);
  if (uVar1 != 0xd8) {
    failure_reason = "Corrupt JPEG";
  }
  fseek((FILE *)f,(long)(int)lVar2,0);
  return (uint)(uVar1 == 0xd8);
}

Assistant:

int stbi_jpeg_test_file(FILE *f)
{
   int n,r;
   jpeg j;
   n = ftell(f);
   start_file(&j.s, f);
   r = decode_jpeg_header(&j, SCAN_type);
   fseek(f,n,SEEK_SET);
   return r;
}